

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

char * __thiscall
fmt::v7::detail::utf8_to_utf16::utf8_to_utf16::anon_class_8_1_8991fb9c::operator()
          (anon_class_8_1_8991fb9c *this,char *p)

{
  uint uVar1;
  utf8_to_utf16 *puVar2;
  wchar_t *pwVar3;
  size_t sVar4;
  char *pcVar5;
  runtime_error *this_00;
  size_t *psVar6;
  wchar_t wVar7;
  undefined8 local_38;
  int error;
  uint32_t cp;
  
  puVar2 = this->this;
  local_38 = 0;
  pcVar5 = utf8_decode(p,(uint32_t *)((long)&local_38 + 4),(int *)&local_38);
  if ((int)local_38 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid utf8");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  wVar7 = local_38._4_4_;
  if ((uint)local_38._4_4_ < 0x10000) {
    if ((puVar2->buffer_).super_buffer<wchar_t>.capacity_ <
        (puVar2->buffer_).super_buffer<wchar_t>.size_ + 1) {
      (**(puVar2->buffer_).super_buffer<wchar_t>._vptr_buffer)(puVar2);
    }
  }
  else {
    uVar1 = local_38._4_4_ + L'\xffff0000';
    local_38 = (ulong)uVar1 << 0x20;
    if ((puVar2->buffer_).super_buffer<wchar_t>.capacity_ <
        (puVar2->buffer_).super_buffer<wchar_t>.size_ + 1) {
      (**(puVar2->buffer_).super_buffer<wchar_t>._vptr_buffer)(puVar2);
    }
    pwVar3 = (puVar2->buffer_).super_buffer<wchar_t>.ptr_;
    sVar4 = (puVar2->buffer_).super_buffer<wchar_t>.size_;
    (puVar2->buffer_).super_buffer<wchar_t>.size_ = sVar4 + 1;
    pwVar3[sVar4] = (uVar1 >> 10) + L'\xd800';
    wVar7 = wVar7 & 0x3ffU | 0xdc00;
    if ((puVar2->buffer_).super_buffer<wchar_t>.capacity_ < sVar4 + 2) {
      (**(puVar2->buffer_).super_buffer<wchar_t>._vptr_buffer)(puVar2);
    }
  }
  psVar6 = &(puVar2->buffer_).super_buffer<wchar_t>.size_;
  pwVar3 = (puVar2->buffer_).super_buffer<wchar_t>.ptr_;
  sVar4 = *psVar6;
  *psVar6 = sVar4 + 1;
  pwVar3[sVar4] = wVar7;
  return pcVar5;
}

Assistant:

FMT_FUNC detail::utf8_to_utf16::utf8_to_utf16(string_view s) {
  auto transcode = [this](const char* p) {
    auto cp = uint32_t();
    auto error = 0;
    p = utf8_decode(p, &cp, &error);
    if (error != 0) FMT_THROW(std::runtime_error("invalid utf8"));
    if (cp <= 0xFFFF) {
      buffer_.push_back(static_cast<wchar_t>(cp));
    } else {
      cp -= 0x10000;
      buffer_.push_back(static_cast<wchar_t>(0xD800 + (cp >> 10)));
      buffer_.push_back(static_cast<wchar_t>(0xDC00 + (cp & 0x3FF)));
    }
    return p;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) p = transcode(p);
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    memcpy(buf, p, to_unsigned(num_chars_left));
    p = buf;
    do {
      p = transcode(p);
    } while (p - buf < num_chars_left);
  }
  buffer_.push_back(0);
}